

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.h
# Opt level: O0

UString * jsonnet::internal::decode_utf8(string *s)

{
  ulong uVar1;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *in_RDI;
  size_t i;
  UString *r;
  ulong uVar2;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *str;
  undefined8 local_20;
  
  str = in_RDI;
  std::__cxx11::u32string::u32string(in_RDI);
  local_20 = 0;
  while (uVar2 = local_20, uVar1 = std::__cxx11::string::length(), uVar2 < uVar1) {
    decode_utf8((string *)str,(size_t *)in_RDI);
    std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
    push_back(in_RDI,(char32_t)(uVar2 >> 0x20));
    local_20 = local_20 + 1;
  }
  return str;
}

Assistant:

static inline UString decode_utf8(const std::string &s)
{
    UString r;
    for (size_t i = 0; i < s.length(); ++i)
        r.push_back(decode_utf8(s, i));
    return r;
}